

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_interpolate.cpp
# Opt level: O2

void __thiscall DPolyobjInterpolation::Interpolate(DPolyobjInterpolation *this,double smoothratio)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  uint uVar4;
  FPolyObj *this_00;
  double *pdVar5;
  double *pdVar6;
  double *pdVar7;
  double dVar8;
  double dVar9;
  ulong uVar10;
  bool bVar11;
  
  this_00 = this->poly;
  pdVar5 = (this->oldverts).Array;
  uVar4 = (this_00->Vertices).Count;
  pdVar6 = (this->bakverts).Array;
  uVar10 = 0;
  bVar11 = false;
  do {
    if ((ulong)uVar4 * 2 == uVar10) {
      if ((this->super_DInterpolation).refcount != 0 || bVar11) {
        dVar2 = (this_00->CenterSpot).pos.X;
        dVar3 = (this_00->CenterSpot).pos.Y;
        this->bakcx = dVar2;
        this->bakcy = dVar3;
        dVar8 = this->oldcy;
        (this_00->CenterSpot).pos.X = (dVar2 - this->oldcx) * smoothratio + dVar2;
        (this_00->CenterSpot).pos.Y = (dVar3 - dVar8) * smoothratio + dVar3;
        FPolyObj::ClearSubsectorLinks(this_00);
        return;
      }
      (*(this->super_DInterpolation).super_DObject._vptr_DObject[4])(this);
      return;
    }
    pdVar7 = *(double **)((long)(this_00->Vertices).Array + uVar10 * 4);
    dVar2 = *pdVar7;
    pdVar6[uVar10 & 0xffffffff] = dVar2;
    dVar3 = pdVar7[1];
    pdVar6[(int)uVar10 + 1] = dVar3;
    pdVar1 = pdVar5 + (uVar10 & 0xffffffff);
    dVar8 = *pdVar1;
    dVar9 = pdVar1[1];
    if ((dVar2 != dVar8) || (NAN(dVar2) || NAN(dVar8))) {
LAB_005f3c9e:
      *pdVar7 = (dVar2 - dVar8) * smoothratio + dVar8;
      pdVar7[1] = (dVar3 - dVar9) * smoothratio + dVar9;
      bVar11 = true;
    }
    else if ((dVar3 != dVar9) || (NAN(dVar3) || NAN(dVar9))) goto LAB_005f3c9e;
    uVar10 = uVar10 + 2;
  } while( true );
}

Assistant:

void DPolyobjInterpolation::Interpolate(double smoothratio)
{
	bool changed = false;
	for(unsigned int i = 0; i < poly->Vertices.Size(); i++)
	{
		bakverts[i*2  ] = poly->Vertices[i]->fX();
		bakverts[i*2+1] = poly->Vertices[i]->fY();

		if (bakverts[i * 2] != oldverts[i * 2] || bakverts[i * 2 + 1] != oldverts[i * 2 + 1])
		{
			changed = true;
			poly->Vertices[i]->set(
				oldverts[i * 2] + (bakverts[i * 2] - oldverts[i * 2]) * smoothratio,
				oldverts[i * 2 + 1] + (bakverts[i * 2 + 1] - oldverts[i * 2 + 1]) * smoothratio);
		}
	}
	if (refcount == 0 && !changed)
	{
		Destroy();
	}
	else
	{
		bakcx = poly->CenterSpot.pos.X;
		bakcy = poly->CenterSpot.pos.Y;
		poly->CenterSpot.pos.X = bakcx + (bakcx - oldcx) * smoothratio;
		poly->CenterSpot.pos.Y = bakcy + (bakcy - oldcy) * smoothratio;

		poly->ClearSubsectorLinks();
	}
}